

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDEntityDecl.cpp
# Opt level: O3

XSerializable * xercesc_4_0::DTDEntityDecl::createObject(MemoryManager *manager)

{
  XMLEntityDecl *this;
  
  this = (XMLEntityDecl *)XMemory::operator_new(0x60,manager);
  XMLEntityDecl::XMLEntityDecl(this,manager);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLEntityDecl_00408758;
  *(undefined2 *)&this[1].super_XSerializable._vptr_XSerializable = 0;
  *(undefined1 *)((long)&this[1].super_XSerializable._vptr_XSerializable + 2) = 0;
  return &this->super_XSerializable;
}

Assistant:

void DTDEntityDecl::serialize(XSerializeEngine& serEng)
{
    XMLEntityDecl::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng<<fDeclaredInIntSubset;
        serEng<<fIsParameter;
        serEng<<fIsSpecialChar;
    }
    else
    {
        serEng>>fDeclaredInIntSubset;
        serEng>>fIsParameter;
        serEng>>fIsSpecialChar;
    }
}